

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printExpressionWas(TapAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  ColourGuard local_20;
  TapAssertionPrinter *local_10;
  TapAssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = AssertionResult::hasExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,';');
    poVar2 = this->stream;
    ColourImpl::guardColour((ColourImpl *)&local_20,(Code)this->colourImpl);
    poVar2 = Catch::operator<<(poVar2,&local_20);
    std::operator<<(poVar2," expression was:");
    ColourImpl::ColourGuard::~ColourGuard(&local_20);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
                if (result.hasExpression()) {
                    stream << ';';
                    stream << colourImpl->guardColour( tapDimColour )
                           << " expression was:";
                    printOriginalExpression();
                }
            }